

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O2

int TPZShapeHCurl<pzshape::TPZShapePrism>::ComputeNConnectShapeF(int icon,int order)

{
  int iVar1;
  int side;
  int order_local;
  int nEdges;
  int nFaces;
  anon_class_32_4_4cae17fc local_28;
  
  side = icon + 6;
  if (order == 0) {
    iVar1 = 0;
  }
  else {
    order_local = order;
    nFaces = pztopology::TPZPrism::NumSides(2);
    nEdges = pztopology::TPZPrism::NumSides(1);
    local_28.nEdges = &nEdges;
    local_28.order = &order_local;
    local_28.side = &side;
    local_28.nFaces = &nFaces;
    iVar1 = ComputeNConnectShapeF::anon_class_32_4_4cae17fc::operator()(&local_28);
  }
  return iVar1;
}

Assistant:

int TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(const int icon, const int order)

{
    constexpr int nNodes = TSHAPE::NCornerNodes;
    const int side = icon + nNodes;
#ifdef PZDEBUG
    if (side < nNodes || side >= TSHAPE::NSides) {
        DebugStop();
    }
#endif
    //given the choice of implementation, there are no shape functions for k=0
    if(order == 0) return 0;
    const auto nFaces = TSHAPE::Dimension < 2 ? 0 : TSHAPE::NumSides(2);
    const auto nEdges = TSHAPE::NumSides(1);
    const int nShapeF = [&](){
        if (side < nNodes + nEdges) {//edge connect
            return 1 + order;
        }
        else if(side < nNodes + nEdges + nFaces){//face connect
            switch(TSHAPE::Type(side)){
            case ETriangle://triangular face
                return (order - 1) * (order+1);
            case EQuadrilateral://quadrilateral face
                return 2 * order * (order+1);
            default:
                PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
                DebugStop();
                return 0;
            }
        }
        else{//internal connect (3D element only)
            if constexpr (TSHAPE::Type() == ETetraedro){
                return (order-1)*(order-2)*(order+1)/2;
            }
            else if constexpr (TSHAPE::Type() == ECube){
                return 3*order*order*(order+1);
            }
            else if constexpr (TSHAPE::Type() == EPrisma){
                return 3*order*(order-1)*(order+1)/2;
            }
            else{
                PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
                DebugStop();
                return 0;
            }
        }
    }();
#ifdef PZ_LOG2
    if (logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << __PRETTY_FUNCTION__<<std::endl;
            sout<<"\tside "<<side<<"\tcon "<<icon<<std::endl;
            sout<<"\torder "<<order<<std::endl;
            sout<<"\tn shape funcs "<<nShapeF;
            LOGPZ_DEBUG(logger,sout.str())
                }
#endif
    return nShapeF;
    
 }